

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

void __thiscall
PerBlockConnectTrace::PerBlockConnectTrace(PerBlockConnectTrace *this,PerBlockConnectTrace *param_1)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = *(undefined4 *)((long)&param_1->pindex + 4);
  uVar4 = *(undefined4 *)
           &(param_1->pblock).super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar5 = *(undefined4 *)
           ((long)&(param_1->pblock).super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 4);
  *(undefined4 *)&this->pindex = *(undefined4 *)&param_1->pindex;
  *(undefined4 *)((long)&this->pindex + 4) = uVar3;
  *(undefined4 *)&(this->pblock).super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = uVar4;
  *(undefined4 *)
   ((long)&(this->pblock).super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) =
       uVar5;
  (this->pblock).super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (param_1->pblock).super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (param_1->pblock).super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->pblock).super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  (param_1->pblock).super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

PerBlockConnectTrace() = default;